

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  QList<QGraphicsItem_*> *other;
  parameter_type pQVar1;
  QGraphicsItemPrivate *this_00;
  value_type_conflict3 vVar2;
  int iVar3;
  int iVar4;
  pointer ppQVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  int i_1;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->indexTimer).m_id == Invalid) goto LAB_005b27e2;
  QBasicTimer::stop();
  purgeRemovedItems(this);
  other = &this->indexedItems;
  for (uVar7 = 0; uVar7 < (ulong)(this->unindexedItems).d.size; uVar7 = uVar7 + 1) {
    pQVar1 = (this->unindexedItems).d.ptr[uVar7];
    if (pQVar1 != (parameter_type)0x0) {
      if ((this->freeItemIndexes).d.size == 0) {
        ((pQVar1->d_ptr).d)->index = (int)(this->indexedItems).d.size;
        QList<QGraphicsItem_*>::append(other,pQVar1);
      }
      else {
        vVar2 = QList<int>::takeFirst(&this->freeItemIndexes);
        ((pQVar1->d_ptr).d)->index = vVar2;
        ppQVar5 = QList<QGraphicsItem_*>::data(other);
        ppQVar5[vVar2] = pQVar1;
      }
    }
  }
  if (this->bspTreeDepth == 0) {
    iVar3 = intmaxlog(this->lastItemCount);
    iVar4 = intmaxlog((int)(this->indexedItems).d.size);
    this->bspTreeDepth = iVar4;
    iVar4 = QGraphicsSceneBspTree::leafCount(&this->bsp);
    if (iVar4 == 0) {
LAB_005b2708:
      this->regenerateIndex = true;
    }
    else if (iVar3 != this->bspTreeDepth) {
      uVar6 = (long)this->lastItemCount - (this->indexedItems).d.size;
      uVar7 = -uVar6;
      if (0 < (long)uVar6) {
        uVar7 = uVar6;
      }
      if (100 < uVar7) goto LAB_005b2708;
    }
  }
  if (this->regenerateIndex == true) {
    this->regenerateIndex = false;
    QGraphicsSceneBspTree::initialize(&this->bsp,&this->sceneRect,this->bspTreeDepth);
    QArrayDataPointer<QGraphicsItem_*>::operator=(&(this->unindexedItems).d,&other->d);
    this->lastItemCount = (int)(this->indexedItems).d.size;
  }
  for (uVar7 = 0; uVar7 < (ulong)(this->unindexedItems).d.size; uVar7 = uVar7 + 1) {
    pQVar1 = (this->unindexedItems).d.ptr[uVar7];
    if (pQVar1 != (parameter_type)0x0) {
      this_00 = (pQVar1->d_ptr).d;
      uVar6 = *(ulong *)&this_00->field_0x160;
      if ((uVar6 & 0x2000040000) == 0) {
        if ((uVar6 & 0x120000) == 0) {
          QGraphicsItemPrivate::sceneEffectiveBoundingRect(&local_58,this_00);
          QGraphicsSceneBspTree::insertItem(&this->bsp,pQVar1,&local_58);
        }
      }
      else {
        QList<QGraphicsItem_*>::append(&this->untransformableItems,pQVar1);
      }
    }
  }
  QList<QGraphicsItem_*>::clear(&this->unindexedItems);
LAB_005b27e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex()
{
    if (!indexTimer.isActive())
        return;

    indexTimer.stop();

    purgeRemovedItems();

     // Add unindexedItems to indexedItems
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            if (!freeItemIndexes.isEmpty()) {
                int freeIndex = freeItemIndexes.takeFirst();
                item->d_func()->index = freeIndex;
                indexedItems[freeIndex] = item;
            } else {
                item->d_func()->index = indexedItems.size();
                indexedItems << item;
            }
        }
    }

    // Determine whether we should regenerate the BSP tree.
    if (bspTreeDepth == 0) {
        int oldDepth = intmaxlog(lastItemCount);
        bspTreeDepth = intmaxlog(indexedItems.size());
        static const int slack = 100;
        if (bsp.leafCount() == 0 || (oldDepth != bspTreeDepth && qAbs(lastItemCount - indexedItems.size()) > slack)) {
            // ### Crude algorithm.
            regenerateIndex = true;
        }
    }

    // Regenerate the tree.
    if (regenerateIndex) {
        regenerateIndex = false;
        bsp.initialize(sceneRect, bspTreeDepth);
        unindexedItems = indexedItems;
        lastItemCount = indexedItems.size();
    }

    // Insert all unindexed items into the tree.
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            if (item->d_ptr->itemIsUntransformable()) {
                untransformableItems << item;
                continue;
            }
            if (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)
                continue;

            bsp.insertItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    }
    unindexedItems.clear();
}